

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainchan.c
# Opt level: O3

void mainchan_ready(mainchan *mc)

{
  mc->ready = true;
  (*mc->cl->vt->set_wants_user_input)(mc->cl,true);
  (*mc->cl->vt->got_user_input)(mc->cl);
  if (mc->eof_pending == true) {
    mc->eof_pending = false;
    if (mc->ready == false) {
      mc->eof_pending = true;
    }
    else if (mc->eof_sent == false) {
      (*mc->sc->vt->write_eof)(mc->sc);
      mc->eof_sent = true;
    }
  }
  ssh_ldisc_update(mc->ppl->ssh);
  queue_idempotent_callback(&mc->ppl->ic_process_queue);
  return;
}

Assistant:

static void mainchan_ready(mainchan *mc)
{
    mc->ready = true;

    ssh_set_wants_user_input(mc->cl, true);
    ssh_got_user_input(mc->cl); /* in case any is already queued */

    /* If an EOF arrived before we were ready, handle it now. */
    if (mc->eof_pending) {
        mc->eof_pending = false;
        mainchan_special_cmd(mc, SS_EOF, 0);
    }

    ssh_ldisc_update(mc->ppl->ssh);
    queue_idempotent_callback(&mc->ppl->ic_process_queue);
}